

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_profiler.c
# Opt level: O1

SUNErrCode SUNProfiler_Reset(SUNProfiler p)

{
  sunTimerStruct *psVar1;
  sunTimespec *psVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  long lVar5;
  SUNHashMap pSVar6;
  
  if (p != (SUNProfiler)0x0) {
    psVar1 = p->overhead;
    psVar2 = psVar1->tic;
    psVar2->tv_sec = 0;
    psVar2->tv_nsec = 0;
    psVar2 = psVar1->toc;
    psVar2->tv_sec = 0;
    psVar2->tv_nsec = 0;
    psVar1->elapsed = 0.0;
    psVar1->count = 0;
    psVar1->average = 0.0;
    psVar1->maximum = 0.0;
    clock_gettime(1,(timespec *)p->overhead->tic);
    pSVar6 = p->map;
    if (0 < pSVar6->max_size) {
      lVar5 = 0;
      do {
        if ((pSVar6->buckets[lVar5] != (SUNHashMapKeyValue)0x0) &&
           (puVar3 = (undefined8 *)pSVar6->buckets[lVar5]->value, puVar3 != (undefined8 *)0x0)) {
          puVar4 = (undefined8 *)*puVar3;
          *puVar4 = 0;
          puVar4[1] = 0;
          puVar4 = (undefined8 *)puVar3[1];
          *puVar4 = 0;
          puVar4[1] = 0;
          puVar3[4] = 0;
          puVar3[5] = 0;
          puVar3[2] = 0;
          puVar3[3] = 0;
        }
        lVar5 = lVar5 + 1;
        pSVar6 = p->map;
      } while (lVar5 < pSVar6->max_size);
    }
    p->sundials_time = 0.0;
    sunStopTiming(p->overhead);
    return 0;
  }
  return -9999;
}

Assistant:

SUNErrCode SUNProfiler_Reset(SUNProfiler p)
{
  int i                 = 0;
  sunTimerStruct* timer = NULL;

  if (!p) { return SUN_ERR_ARG_CORRUPT; }

  /* Reset the overhead timer */
  sunResetTiming(p->overhead);
  sunStartTiming(p->overhead);

  /* Reset all timers */
  for (i = 0; i < p->map->max_size; i++)
  {
    if (!(p->map->buckets[i])) { continue; }
    timer = p->map->buckets[i]->value;
    if (timer) { sunResetTiming(timer); }
  }

  /* Reset the overall timer. */
  p->sundials_time = 0.0;

  SUNDIALS_MARK_BEGIN(p, SUNDIALS_ROOT_TIMER);
  sunStopTiming(p->overhead);

  return SUN_SUCCESS;
}